

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStructTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Functional::LocalStructTests::init(LocalStructTests *this,EVP_PKEY_CTX *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Context *pCVar2;
  int extraout_EAX;
  LineStream *pLVar3;
  ShaderStructCase *pSVar4;
  LineStream local_1c0;
  
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  paVar1 = &local_1c0.m_string.field_2;
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec3\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tS s = S(${COORDS}.x, vec3(0.0), ui_one);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts.b = ${COORDS}.yzw;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = vec4(s.a, s.b.x, s.b.y, s.c);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"basic_vertex","Basic struct usage",true,0,
                            init()::Eval_basic::eval(deqp::gls::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec3\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tS s = S(${COORDS}.x, vec3(0.0), ui_one);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts.b = ${COORDS}.yzw;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = vec4(s.a, s.b.x, s.b.y, s.c);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"basic_fragment","Basic struct usage",false,0,
                            init()::Eval_basic::eval(deqp::gls::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec2\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tT\t\t\t\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,"\tS s = S(${COORDS}.x, T(0, vec2(0.0)), ui_one);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts.b = T(ui_zero, ${COORDS}.yz);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = vec4(s.a, s.b.b, s.b.a + s.c);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"nested_vertex","Nested struct",true,0,
                            init()::Eval_nested::eval(deqp::gls::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec2\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tT\t\t\t\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,"\tS s = S(${COORDS}.x, T(0, vec2(0.0)), ui_one);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts.b = T(ui_zero, ${COORDS}.yz);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = vec4(s.a, s.b.b, s.b.a + s.c);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"nested_fragment","Nested struct",false,0,
                            init()::Eval_nested::eval(deqp::gls::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\tb[3];");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tS s;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts.a = ${COORDS}.w;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts.c = ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts.b[0] = ${COORDS}.z;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts.b[1] = ${COORDS}.y;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts.b[2] = ${COORDS}.x;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = vec4(s.a, s.b[0], s.b[1], s.c);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"array_member_vertex","Struct with array member",true,0,
                            init()::Eval_array_member::eval(deqp::gls::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\tb[3];");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tS s;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts.a = ${COORDS}.w;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts.c = ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts.b[0] = ${COORDS}.z;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts.b[1] = ${COORDS}.y;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts.b[2] = ${COORDS}.x;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = vec4(s.a, s.b[0], s.b[1], s.c);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"array_member_fragment","Struct with array member",false,0,
                            init()::Eval_array_member::eval(deqp::gls::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\tb[3];");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tS s;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts.a = ${COORDS}.w;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts.c = ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts.b[0] = ${COORDS}.z;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts.b[1] = ${COORDS}.y;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts.b[2] = ${COORDS}.x;");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,"\t${DST} = vec4(s.b[ui_one], s.b[ui_zero], s.b[ui_two], s.c);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"array_member_dynamic_index_vertex",
                            "Struct with array member, dynamic indexing",true,4,
                            init()::Eval_array_member_dynamic_index::eval(deqp::gls::
                            ShaderEvalContext__,(SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\tb[3];");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tS s;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts.a = ${COORDS}.w;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts.c = ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts.b[0] = ${COORDS}.z;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts.b[1] = ${COORDS}.y;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts.b[2] = ${COORDS}.x;");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,"\t${DST} = vec4(s.b[ui_one], s.b[ui_zero], s.b[ui_two], s.c);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"array_member_dynamic_index_fragment",
                            "Struct with array member, dynamic indexing",false,4,
                            init()::Eval_array_member_dynamic_index::eval(deqp::gls::
                            ShaderEvalContext__,(SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump int\t\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tS s[3];");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0] = S(${COORDS}.x, ui_zero);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].a = ${COORDS}.y;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b = ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[2] = S(${COORDS}.z, ui_two);");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,"\t${DST} = vec4(s[2].a, s[1].a, s[0].a, s[2].b - s[1].b + s[0].b);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"struct_array_vertex","Struct array",true,0,
                            init()::Eval_struct_array::eval(deqp::gls::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump int\t\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tS s[3];");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0] = S(${COORDS}.x, ui_zero);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].a = ${COORDS}.y;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b = ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[2] = S(${COORDS}.z, ui_two);");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,"\t${DST} = vec4(s[2].a, s[1].a, s[0].a, s[2].b - s[1].b + s[0].b);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"struct_array_fragment","Struct array",false,0,
                            init()::Eval_struct_array::eval(deqp::gls::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump int\t\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tS s[3];");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0] = S(${COORDS}.x, ui_zero);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].a = ${COORDS}.y;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b = ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[2] = S(${COORDS}.z, ui_two);");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\t${DST} = vec4(s[ui_two].a, s[ui_one].a, s[ui_zero].a, s[ui_two].b - s[ui_one].b + s[ui_zero].b);"
                     );
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"struct_array_dynamic_index_vertex",
                            "Struct array with dynamic indexing",true,4,
                            init()::Eval_struct_array_dynamic_index::eval(deqp::gls::
                            ShaderEvalContext__,(SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump int\t\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tS s[3];");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0] = S(${COORDS}.x, ui_zero);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].a = ${COORDS}.y;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b = ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[2] = S(${COORDS}.z, ui_two);");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\t${DST} = vec4(s[ui_two].a, s[ui_one].a, s[ui_zero].a, s[ui_two].b - s[ui_one].b + s[ui_zero].b);"
                     );
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"struct_array_dynamic_index_fragment",
                            "Struct array with dynamic indexing",false,4,
                            init()::Eval_struct_array_dynamic_index::eval(deqp::gls::
                            ShaderEvalContext__,(SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_two;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_three;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_four;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_half;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_third;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_fourth;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec2\tb[2];");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tT\t\t\t\tb[3];");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tS s[2];");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t// S[0]");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].a         = ${COORDS}.x;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[0].a    = uf_half;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[0].b[0] = ${COORDS}.xy;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[0].b[1] = ${COORDS}.zw;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[1].a    = uf_third;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[1].b[0] = ${COORDS}.zw;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[1].b[1] = ${COORDS}.xy;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[2].a    = uf_fourth;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[2].b[0] = ${COORDS}.xz;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[2].b[1] = ${COORDS}.yw;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].c         = ui_zero;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t// S[1]");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].a         = ${COORDS}.w;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[0].a    = uf_two;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[0].b[0] = ${COORDS}.xx;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[0].b[1] = ${COORDS}.yy;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[1].a    = uf_three;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[1].b[0] = ${COORDS}.zz;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[1].b[1] = ${COORDS}.ww;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[2].a    = uf_four;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[2].b[0] = ${COORDS}.yx;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[2].b[1] = ${COORDS}.wz;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].c         = ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\tmediump float r = (s[0].b[1].b[0].x + s[1].b[2].b[1].y) * s[0].b[0].a; // (z + z) * 0.5"
                     );
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\tmediump float g = s[1].b[0].b[0].y * s[0].b[2].a * s[1].b[2].a; // x * 0.25 * 4"
                     );
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\tmediump float b = (s[0].b[2].b[1].y + s[0].b[1].b[0].y + s[1].a) * s[0].b[1].a; // (w + w + w) * 0.333"
                     );
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\tmediump float a = float(s[0].c) + s[1].b[2].a - s[1].b[1].a; // 0 + 4.0 - 3.0"
                     );
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = vec4(r, g, b, a);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"nested_struct_array_vertex","Nested struct array",true,0,
                            init()::Eval_nested_struct_array::eval(deqp::gls::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_two;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_three;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_four;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_half;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_third;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_fourth;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec2\tb[2];");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tT\t\t\t\tb[3];");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tS s[2];");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t// S[0]");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].a         = ${COORDS}.x;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[0].a    = uf_half;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[0].b[0] = ${COORDS}.xy;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[0].b[1] = ${COORDS}.zw;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[1].a    = uf_third;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[1].b[0] = ${COORDS}.zw;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[1].b[1] = ${COORDS}.xy;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[2].a    = uf_fourth;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[2].b[0] = ${COORDS}.xz;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[2].b[1] = ${COORDS}.yw;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].c         = ui_zero;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t// S[1]");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].a         = ${COORDS}.w;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[0].a    = uf_two;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[0].b[0] = ${COORDS}.xx;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[0].b[1] = ${COORDS}.yy;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[1].a    = uf_three;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[1].b[0] = ${COORDS}.zz;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[1].b[1] = ${COORDS}.ww;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[2].a    = uf_four;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[2].b[0] = ${COORDS}.yx;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[2].b[1] = ${COORDS}.wz;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].c         = ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\tmediump float r = (s[0].b[1].b[0].x + s[1].b[2].b[1].y) * s[0].b[0].a; // (z + z) * 0.5"
                     );
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\tmediump float g = s[1].b[0].b[0].y * s[0].b[2].a * s[1].b[2].a; // x * 0.25 * 4"
                     );
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\tmediump float b = (s[0].b[2].b[1].y + s[0].b[1].b[0].y + s[1].a) * s[0].b[1].a; // (w + w + w) * 0.333"
                     );
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\tmediump float a = float(s[0].c) + s[1].b[2].a - s[1].b[1].a; // 0 + 4.0 - 3.0"
                     );
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = vec4(r, g, b, a);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"nested_struct_array_fragment","Nested struct array",false,0,
                            init()::Eval_nested_struct_array::eval(deqp::gls::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_two;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_three;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_four;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_half;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_third;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_fourth;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec2\tb[2];");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tT\t\t\t\tb[3];");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tS s[2];");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t// S[0]");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].a         = ${COORDS}.x;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[0].a    = uf_half;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[0].b[0] = ${COORDS}.xy;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[0].b[1] = ${COORDS}.zw;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[1].a    = uf_third;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[1].b[0] = ${COORDS}.zw;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[1].b[1] = ${COORDS}.xy;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[2].a    = uf_fourth;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[2].b[0] = ${COORDS}.xz;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[2].b[1] = ${COORDS}.yw;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].c         = ui_zero;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t// S[1]");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].a         = ${COORDS}.w;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[0].a    = uf_two;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[0].b[0] = ${COORDS}.xx;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[0].b[1] = ${COORDS}.yy;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[1].a    = uf_three;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[1].b[0] = ${COORDS}.zz;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[1].b[1] = ${COORDS}.ww;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[2].a    = uf_four;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[2].b[0] = ${COORDS}.yx;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[2].b[1] = ${COORDS}.wz;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].c         = ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\tmediump float r = (s[0].b[ui_one].b[ui_one-1].x + s[ui_one].b[ui_two].b[ui_zero+1].y) * s[0].b[0].a; // (z + z) * 0.5"
                     );
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\tmediump float g = s[ui_two-1].b[ui_two-2].b[ui_zero].y * s[0].b[ui_two].a * s[ui_one].b[2].a; // x * 0.25 * 4"
                     );
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\tmediump float b = (s[ui_zero].b[ui_one+1].b[1].y + s[0].b[ui_one*ui_one].b[0].y + s[ui_one].a) * s[0].b[ui_two-ui_one].a; // (w + w + w) * 0.333"
                     );
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\tmediump float a = float(s[ui_zero].c) + s[ui_one-ui_zero].b[ui_two].a - s[ui_zero+ui_one].b[ui_two-ui_one].a; // 0 + 4.0 - 3.0"
                     );
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = vec4(r, g, b, a);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"nested_struct_array_dynamic_index_vertex",
                            "Nested struct array with dynamic indexing",true,4,
                            init()::Eval_nested_struct_array_dynamic_index::eval(deqp::gls::
                            ShaderEvalContext__,(SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_two;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_three;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_four;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_half;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_third;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_fourth;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec2\tb[2];");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tT\t\t\t\tb[3];");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tS s[2];");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t// S[0]");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].a         = ${COORDS}.x;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[0].a    = uf_half;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[0].b[0] = ${COORDS}.xy;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[0].b[1] = ${COORDS}.zw;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[1].a    = uf_third;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[1].b[0] = ${COORDS}.zw;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[1].b[1] = ${COORDS}.xy;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[2].a    = uf_fourth;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[2].b[0] = ${COORDS}.xz;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[2].b[1] = ${COORDS}.yw;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].c         = ui_zero;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t// S[1]");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].a         = ${COORDS}.w;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[0].a    = uf_two;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[0].b[0] = ${COORDS}.xx;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[0].b[1] = ${COORDS}.yy;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[1].a    = uf_three;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[1].b[0] = ${COORDS}.zz;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[1].b[1] = ${COORDS}.ww;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[2].a    = uf_four;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[2].b[0] = ${COORDS}.yx;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[2].b[1] = ${COORDS}.wz;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].c         = ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\tmediump float r = (s[0].b[ui_one].b[ui_one-1].x + s[ui_one].b[ui_two].b[ui_zero+1].y) * s[0].b[0].a; // (z + z) * 0.5"
                     );
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\tmediump float g = s[ui_two-1].b[ui_two-2].b[ui_zero].y * s[0].b[ui_two].a * s[ui_one].b[2].a; // x * 0.25 * 4"
                     );
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\tmediump float b = (s[ui_zero].b[ui_one+1].b[1].y + s[0].b[ui_one*ui_one].b[0].y + s[ui_one].a) * s[0].b[ui_two-ui_one].a; // (w + w + w) * 0.333"
                     );
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\tmediump float a = float(s[ui_zero].c) + s[ui_one-ui_zero].b[ui_two].a - s[ui_zero+ui_one].b[ui_two-ui_one].a; // 0 + 4.0 - 3.0"
                     );
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = vec4(r, g, b, a);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"nested_struct_array_dynamic_index_fragment",
                            "Nested struct array with dynamic indexing",false,4,
                            init()::Eval_nested_struct_array_dynamic_index::eval(deqp::gls::
                            ShaderEvalContext__,(SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec3\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"mediump vec4 myFunc (S s)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\treturn vec4(s.a, s.b.x, s.b.y, s.c);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tS s = S(${COORDS}.x, vec3(0.0), ui_one);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts.b = ${COORDS}.yzw;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = myFunc(s);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"parameter_vertex","Struct as a function parameter",true,0,
                            init()::Eval_parameter::eval(deqp::gls::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec3\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"mediump vec4 myFunc (S s)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\treturn vec4(s.a, s.b.x, s.b.y, s.c);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tS s = S(${COORDS}.x, vec3(0.0), ui_one);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts.b = ${COORDS}.yzw;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = myFunc(s);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"parameter_fragment","Struct as a function parameter",false,0,
                            init()::Eval_parameter::eval(deqp::gls::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec2\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tT\t\t\t\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"mediump vec4 myFunc (S s)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\treturn vec4(s.a, s.b.b, s.b.a + s.c);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,"\tS s = S(${COORDS}.x, T(0, vec2(0.0)), ui_one);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts.b = T(ui_zero, ${COORDS}.yz);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = myFunc(s);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"parameter_nested_vertex","Nested struct as a function parameter"
                            ,true,0,init()::Eval_parameter_nested::eval(deqp::gls::
                                    ShaderEvalContext__,(SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec2\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tT\t\t\t\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"mediump vec4 myFunc (S s)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\treturn vec4(s.a, s.b.b, s.b.a + s.c);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,"\tS s = S(${COORDS}.x, T(0, vec2(0.0)), ui_one);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts.b = T(ui_zero, ${COORDS}.yz);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = myFunc(s);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"parameter_nested_fragment",
                            "Nested struct as a function parameter",false,0,
                            init()::Eval_parameter_nested::eval(deqp::gls::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec3\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"S myFunc (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tS s = S(${COORDS}.x, vec3(0.0), ui_one);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts.b = ${COORDS}.yzw;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\treturn s;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tS s = myFunc();");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = vec4(s.a, s.b.x, s.b.y, s.c);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"return_vertex","Struct as a return value",true,0,
                            init()::Eval_return::eval(deqp::gls::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec3\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"S myFunc (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tS s = S(${COORDS}.x, vec3(0.0), ui_one);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts.b = ${COORDS}.yzw;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\treturn s;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tS s = myFunc();");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = vec4(s.a, s.b.x, s.b.y, s.c);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"return_fragment","Struct as a return value",false,0,
                            init()::Eval_return::eval(deqp::gls::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec2\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tT\t\t\t\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"S myFunc (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,"\tS s = S(${COORDS}.x, T(0, vec2(0.0)), ui_one);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts.b = T(ui_zero, ${COORDS}.yz);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\treturn s;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tS s = myFunc();");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = vec4(s.a, s.b.b, s.b.a + s.c);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"return_nested_vertex","Nested struct",true,0,
                            init()::Eval_return_nested::eval(deqp::gls::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec2\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tT\t\t\t\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"S myFunc (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,"\tS s = S(${COORDS}.x, T(0, vec2(0.0)), ui_one);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts.b = T(ui_zero, ${COORDS}.yz);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\treturn s;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tS s = myFunc();");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = vec4(s.a, s.b.b, s.b.a + s.c);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"return_nested_fragment","Nested struct",false,0,
                            init()::Eval_return_nested::eval(deqp::gls::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec3\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,"\tS s = S(${COORDS}.x, ${COORDS}.yzw, ui_zero);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tif (uf_one > 0.0)");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,"\t\ts = S(${COORDS}.w, ${COORDS}.zyx, ui_one);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = vec4(s.a, s.b.xy, s.c);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"conditional_assignment_vertex","Conditional struct assignment",
                            true,0,init()::Eval_conditional_assignment::eval(deqp::gls::
                                   ShaderEvalContext__,(SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec3\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,"\tS s = S(${COORDS}.x, ${COORDS}.yzw, ui_zero);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tif (uf_one > 0.0)");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,"\t\ts = S(${COORDS}.w, ${COORDS}.zyx, ui_one);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = vec4(s.a, s.b.xy, s.c);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"conditional_assignment_fragment","Conditional struct assignment"
                            ,false,0,init()::Eval_conditional_assignment::eval(deqp::gls::
                                     ShaderEvalContext__,(SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec3\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,"\tS s = S(${COORDS}.x, ${COORDS}.yzw, ui_zero);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tfor (int i = 0; i < 3; i++)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\tif (i == 1)");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,"\t\t\ts = S(${COORDS}.w, ${COORDS}.zyx, ui_one);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = vec4(s.a, s.b.xy, s.c);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"loop_assignment_vertex","Struct assignment in loop",true,0,
                            init()::Eval_loop_assignment::eval(deqp::gls::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec3\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,"\tS s = S(${COORDS}.x, ${COORDS}.yzw, ui_zero);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tfor (int i = 0; i < 3; i++)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\tif (i == 1)");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,"\t\t\ts = S(${COORDS}.w, ${COORDS}.zyx, ui_one);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = vec4(s.a, s.b.xy, s.c);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"loop_assignment_fragment","Struct assignment in loop",false,0,
                            init()::Eval_loop_assignment::eval(deqp::gls::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_three;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec3\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,"\tS s = S(${COORDS}.x, ${COORDS}.yzw, ui_zero);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tfor (int i = 0; i < ui_three; i++)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\tif (i == ui_one)");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,"\t\t\ts = S(${COORDS}.w, ${COORDS}.zyx, ui_one);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = vec4(s.a, s.b.xy, s.c);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"dynamic_loop_assignment_vertex","Struct assignment in loop",true
                            ,4,init()::Eval_dynamic_loop_assignment::eval(deqp::gls::
                               ShaderEvalContext__,(SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_three;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec3\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,"\tS s = S(${COORDS}.x, ${COORDS}.yzw, ui_zero);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tfor (int i = 0; i < ui_three; i++)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\tif (i == ui_one)");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,"\t\t\ts = S(${COORDS}.w, ${COORDS}.zyx, ui_one);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = vec4(s.a, s.b.xy, s.c);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"dynamic_loop_assignment_fragment","Struct assignment in loop",
                            false,4,init()::Eval_dynamic_loop_assignment::eval(deqp::gls::
                                    ShaderEvalContext__,(SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec2\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tT\t\t\t\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,"\tS s = S(${COORDS}.x, T(ui_one, ${COORDS}.yz), ui_one);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tif (uf_one > 0.0)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\ts.b = T(ui_zero, ${COORDS}.zw);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = vec4(s.a, s.b.b, s.c - s.b.a);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"nested_conditional_assignment_vertex",
                            "Conditional assignment of nested struct",true,0,
                            init()::Eval_nested_conditional_assignment::eval(deqp::gls::
                            ShaderEvalContext__,(SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec2\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tT\t\t\t\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,"\tS s = S(${COORDS}.x, T(ui_one, ${COORDS}.yz), ui_one);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tif (uf_one > 0.0)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\ts.b = T(ui_zero, ${COORDS}.zw);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = vec4(s.a, s.b.b, s.c - s.b.a);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"nested_conditional_assignment_fragment",
                            "Conditional assignment of nested struct",false,0,
                            init()::Eval_nested_conditional_assignment::eval(deqp::gls::
                            ShaderEvalContext__,(SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec2\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tT\t\t\t\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,"\tS s = S(${COORDS}.x, T(ui_one, ${COORDS}.yz), ui_one);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tfor (int i = 0; i < 3; i++)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\tif (i == 1)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t\ts.b = T(ui_zero, ${COORDS}.zw);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = vec4(s.a, s.b.b, s.c - s.b.a);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"nested_loop_assignment_vertex",
                            "Nested struct assignment in loop",true,0,
                            init()::Eval_nested_loop_assignment::eval(deqp::gls::ShaderEvalContext__
                            ,(SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec2\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tT\t\t\t\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,"\tS s = S(${COORDS}.x, T(ui_one, ${COORDS}.yz), ui_one);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tfor (int i = 0; i < 3; i++)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\tif (i == 1)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t\ts.b = T(ui_zero, ${COORDS}.zw);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = vec4(s.a, s.b.b, s.c - s.b.a);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"nested_loop_assignment_fragment",
                            "Nested struct assignment in loop",false,0,
                            init()::Eval_nested_loop_assignment::eval(deqp::gls::ShaderEvalContext__
                            ,(SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_three;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec2\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tT\t\t\t\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,"\tS s = S(${COORDS}.x, T(ui_one, ${COORDS}.yz), ui_one);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tfor (int i = 0; i < ui_three; i++)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\tif (i == ui_one)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t\ts.b = T(ui_zero, ${COORDS}.zw);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = vec4(s.a, s.b.b, s.c - s.b.a);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"nested_dynamic_loop_assignment_vertex",
                            "Nested struct assignment in dynamic loop",true,4,
                            init()::Eval_nested_dynamic_loop_assignment::eval(deqp::gls::
                            ShaderEvalContext__,(SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_three;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec2\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tT\t\t\t\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,"\tS s = S(${COORDS}.x, T(ui_one, ${COORDS}.yz), ui_one);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tfor (int i = 0; i < ui_three; i++)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\tif (i == ui_one)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t\ts.b = T(ui_zero, ${COORDS}.zw);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = vec4(s.a, s.b.b, s.c - s.b.a);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"nested_dynamic_loop_assignment_fragment",
                            "Nested struct assignment in dynamic loop",false,4,
                            init()::Eval_nested_dynamic_loop_assignment::eval(deqp::gls::
                            ShaderEvalContext__,(SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump int\t\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tS s[3];");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0] = S(${COORDS}.x, ui_zero);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].a = ${COORDS}.y;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b = -ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[2] = S(${COORDS}.z, ui_two);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float rgb[3];");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint alpha = 0;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tfor (int i = 0; i < 3; i++)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\trgb[i] = s[2-i].a;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\talpha += s[i].b;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t}");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,"\t${DST} = vec4(rgb[0], rgb[1], rgb[2], alpha);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"loop_struct_array_vertex","Struct array usage in loop",true,0,
                            init()::Eval_loop_struct_array::eval(deqp::gls::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump int\t\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tS s[3];");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0] = S(${COORDS}.x, ui_zero);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].a = ${COORDS}.y;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b = -ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[2] = S(${COORDS}.z, ui_two);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float rgb[3];");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint alpha = 0;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tfor (int i = 0; i < 3; i++)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\trgb[i] = s[2-i].a;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\talpha += s[i].b;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t}");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,"\t${DST} = vec4(rgb[0], rgb[1], rgb[2], alpha);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"loop_struct_array_fragment","Struct array usage in loop",false,0
                            ,init()::Eval_loop_struct_array::eval(deqp::gls::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_two;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_three;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_four;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_half;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_third;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_fourth;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_sixth;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec2\tb[2];");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tT\t\t\t\tb[3];");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tS s[2];");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t// S[0]");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].a         = ${COORDS}.x;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[0].a    = uf_half;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[0].b[0] = ${COORDS}.yx;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[0].b[1] = ${COORDS}.zx;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[1].a    = uf_third;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[1].b[0] = ${COORDS}.yy;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[1].b[1] = ${COORDS}.wy;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[2].a    = uf_fourth;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[2].b[0] = ${COORDS}.zx;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[2].b[1] = ${COORDS}.zy;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].c         = ui_zero;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t// S[1]");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].a         = ${COORDS}.w;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[0].a    = uf_two;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[0].b[0] = ${COORDS}.zx;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[0].b[1] = ${COORDS}.zy;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[1].a    = uf_three;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[1].b[0] = ${COORDS}.zz;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[1].b[1] = ${COORDS}.ww;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[2].a    = uf_four;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[2].b[0] = ${COORDS}.yx;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[2].b[1] = ${COORDS}.wz;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].c         = ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float r = 0.0; // (x*3 + y*3) / 6.0")
  ;
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float g = 0.0; // (y*3 + z*3) / 6.0")
  ;
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float b = 0.0; // (z*3 + w*3) / 6.0")
  ;
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float a = 1.0;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tfor (int i = 0; i < 2; i++)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\tfor (int j = 0; j < 3; j++)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t\tr += s[0].b[j].b[i].y;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t\tg += s[i].b[j].b[0].x;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t\tb += s[i].b[j].b[1].x;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t\ta *= s[i].b[j].a;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t}");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,"\t${DST} = vec4(r*uf_sixth, g*uf_sixth, b*uf_sixth, a);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"loop_nested_struct_array_vertex",
                            "Nested struct array usage in loop",true,0,
                            init()::Eval_loop_nested_struct_array::eval(deqp::gls::
                            ShaderEvalContext__,(SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_two;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_three;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_four;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_half;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_third;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_fourth;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_sixth;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec2\tb[2];");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tT\t\t\t\tb[3];");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tS s[2];");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t// S[0]");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].a         = ${COORDS}.x;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[0].a    = uf_half;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[0].b[0] = ${COORDS}.yx;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[0].b[1] = ${COORDS}.zx;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[1].a    = uf_third;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[1].b[0] = ${COORDS}.yy;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[1].b[1] = ${COORDS}.wy;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[2].a    = uf_fourth;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[2].b[0] = ${COORDS}.zx;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[2].b[1] = ${COORDS}.zy;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].c         = ui_zero;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t// S[1]");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].a         = ${COORDS}.w;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[0].a    = uf_two;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[0].b[0] = ${COORDS}.zx;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[0].b[1] = ${COORDS}.zy;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[1].a    = uf_three;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[1].b[0] = ${COORDS}.zz;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[1].b[1] = ${COORDS}.ww;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[2].a    = uf_four;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[2].b[0] = ${COORDS}.yx;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[2].b[1] = ${COORDS}.wz;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].c         = ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float r = 0.0; // (x*3 + y*3) / 6.0")
  ;
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float g = 0.0; // (y*3 + z*3) / 6.0")
  ;
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float b = 0.0; // (z*3 + w*3) / 6.0")
  ;
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float a = 1.0;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tfor (int i = 0; i < 2; i++)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\tfor (int j = 0; j < 3; j++)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t\tr += s[0].b[j].b[i].y;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t\tg += s[i].b[j].b[0].x;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t\tb += s[i].b[j].b[1].x;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t\ta *= s[i].b[j].a;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t}");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,"\t${DST} = vec4(r*uf_sixth, g*uf_sixth, b*uf_sixth, a);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"loop_nested_struct_array_fragment",
                            "Nested struct array usage in loop",false,0,
                            init()::Eval_loop_nested_struct_array::eval(deqp::gls::
                            ShaderEvalContext__,(SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_three;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump int\t\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tS s[3];");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0] = S(${COORDS}.x, ui_zero);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].a = ${COORDS}.y;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b = -ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[2] = S(${COORDS}.z, ui_two);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float rgb[3];");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint alpha = 0;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tfor (int i = 0; i < ui_three; i++)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\trgb[i] = s[2-i].a;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\talpha += s[i].b;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t}");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,"\t${DST} = vec4(rgb[0], rgb[1], rgb[2], alpha);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"dynamic_loop_struct_array_vertex",
                            "Struct array usage in dynamic loop",true,6,
                            init()::Eval_dynamic_loop_struct_array::eval(deqp::gls::
                            ShaderEvalContext__,(SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_three;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump int\t\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tS s[3];");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0] = S(${COORDS}.x, ui_zero);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].a = ${COORDS}.y;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b = -ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[2] = S(${COORDS}.z, ui_two);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float rgb[3];");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint alpha = 0;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tfor (int i = 0; i < ui_three; i++)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\trgb[i] = s[2-i].a;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\talpha += s[i].b;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t}");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,"\t${DST} = vec4(rgb[0], rgb[1], rgb[2], alpha);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"dynamic_loop_struct_array_fragment",
                            "Struct array usage in dynamic loop",false,6,
                            init()::Eval_dynamic_loop_struct_array::eval(deqp::gls::
                            ShaderEvalContext__,(SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_three;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_two;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_three;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_four;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_half;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_third;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_fourth;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_sixth;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec2\tb[2];");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tT\t\t\t\tb[3];");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tS s[2];");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t// S[0]");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].a         = ${COORDS}.x;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[0].a    = uf_half;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[0].b[0] = ${COORDS}.yx;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[0].b[1] = ${COORDS}.zx;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[1].a    = uf_third;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[1].b[0] = ${COORDS}.yy;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[1].b[1] = ${COORDS}.wy;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[2].a    = uf_fourth;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[2].b[0] = ${COORDS}.zx;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[2].b[1] = ${COORDS}.zy;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].c         = ui_zero;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t// S[1]");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].a         = ${COORDS}.w;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[0].a    = uf_two;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[0].b[0] = ${COORDS}.zx;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[0].b[1] = ${COORDS}.zy;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[1].a    = uf_three;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[1].b[0] = ${COORDS}.zz;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[1].b[1] = ${COORDS}.ww;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[2].a    = uf_four;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[2].b[0] = ${COORDS}.yx;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[2].b[1] = ${COORDS}.wz;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].c         = ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float r = 0.0; // (x*3 + y*3) / 6.0")
  ;
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float g = 0.0; // (y*3 + z*3) / 6.0")
  ;
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float b = 0.0; // (z*3 + w*3) / 6.0")
  ;
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float a = 1.0;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tfor (int i = 0; i < ui_two; i++)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\tfor (int j = 0; j < ui_three; j++)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t\tr += s[0].b[j].b[i].y;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t\tg += s[i].b[j].b[0].x;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t\tb += s[i].b[j].b[1].x;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t\ta *= s[i].b[j].a;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t}");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,"\t${DST} = vec4(r*uf_sixth, g*uf_sixth, b*uf_sixth, a);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"dynamic_loop_nested_struct_array_vertex",
                            "Nested struct array usage in dynamic loop",true,6,
                            init()::Eval_dynamic_loop_nested_struct_array::eval(deqp::gls::
                            ShaderEvalContext__,(SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_three;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_two;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_three;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_four;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_half;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_third;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_fourth;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_sixth;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec2\tb[2];");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tT\t\t\t\tb[3];");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tS s[2];");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t// S[0]");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].a         = ${COORDS}.x;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[0].a    = uf_half;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[0].b[0] = ${COORDS}.yx;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[0].b[1] = ${COORDS}.zx;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[1].a    = uf_third;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[1].b[0] = ${COORDS}.yy;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[1].b[1] = ${COORDS}.wy;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[2].a    = uf_fourth;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[2].b[0] = ${COORDS}.zx;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].b[2].b[1] = ${COORDS}.zy;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[0].c         = ui_zero;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t// S[1]");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].a         = ${COORDS}.w;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[0].a    = uf_two;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[0].b[0] = ${COORDS}.zx;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[0].b[1] = ${COORDS}.zy;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[1].a    = uf_three;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[1].b[0] = ${COORDS}.zz;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[1].b[1] = ${COORDS}.ww;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[2].a    = uf_four;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[2].b[0] = ${COORDS}.yx;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].b[2].b[1] = ${COORDS}.wz;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\ts[1].c         = ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float r = 0.0; // (x*3 + y*3) / 6.0")
  ;
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float g = 0.0; // (y*3 + z*3) / 6.0")
  ;
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float b = 0.0; // (z*3 + w*3) / 6.0")
  ;
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float a = 1.0;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tfor (int i = 0; i < ui_two; i++)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\tfor (int j = 0; j < ui_three; j++)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t{");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t\tr += s[0].b[j].b[i].y;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t\tg += s[i].b[j].b[0].x;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t\tb += s[i].b[j].b[1].x;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t\ta *= s[i].b[j].a;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t}");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,"\t${DST} = vec4(r*uf_sixth, g*uf_sixth, b*uf_sixth, a);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"dynamic_loop_nested_struct_array_fragment",
                            "Nested struct array usage in dynamic loop",false,6,
                            init()::Eval_dynamic_loop_nested_struct_array::eval(deqp::gls::
                            ShaderEvalContext__,(SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec3\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\tS a = S(floor(${COORDS}.x), vec3(0.0, floor(${COORDS}.y), 2.3), ui_one);");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\tS b = S(floor(${COORDS}.x+0.5), vec3(0.0, floor(${COORDS}.y), 2.3), ui_one);"
                     );
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\tS c = S(floor(${COORDS}.x), vec3(0.0, floor(${COORDS}.y+0.5), 2.3), ui_one);"
                     );
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\tS d = S(floor(${COORDS}.x), vec3(0.0, floor(${COORDS}.y), 2.3), ui_two);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = vec4(0.0, 0.0, 0.0, 1.0);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tif (a == b) ${DST}.x = 1.0;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tif (a == c) ${DST}.y = 1.0;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tif (a == d) ${DST}.z = 1.0;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"basic_equal_vertex","Basic struct equality",true,0,
                            init()::Eval_basic_equal::eval(deqp::gls::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec3\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\tS a = S(floor(${COORDS}.x), vec3(0.0, floor(${COORDS}.y), 2.3), ui_one);");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\tS b = S(floor(${COORDS}.x+0.5), vec3(0.0, floor(${COORDS}.y), 2.3), ui_one);"
                     );
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\tS c = S(floor(${COORDS}.x), vec3(0.0, floor(${COORDS}.y+0.5), 2.3), ui_one);"
                     );
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\tS d = S(floor(${COORDS}.x), vec3(0.0, floor(${COORDS}.y), 2.3), ui_two);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = vec4(0.0, 0.0, 0.0, 1.0);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tif (a == b) ${DST}.x = 1.0;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tif (a == c) ${DST}.y = 1.0;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tif (a == d) ${DST}.z = 1.0;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"basic_equal_fragment","Basic struct equality",false,0,
                            init()::Eval_basic_equal::eval(deqp::gls::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec3\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\tS a = S(floor(${COORDS}.x), vec3(0.0, floor(${COORDS}.y), 2.3), ui_one);");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\tS b = S(floor(${COORDS}.x+0.5), vec3(0.0, floor(${COORDS}.y), 2.3), ui_one);"
                     );
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\tS c = S(floor(${COORDS}.x), vec3(0.0, floor(${COORDS}.y+0.5), 2.3), ui_one);"
                     );
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\tS d = S(floor(${COORDS}.x), vec3(0.0, floor(${COORDS}.y), 2.3), ui_two);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = vec4(0.0, 0.0, 0.0, 1.0);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tif (a != b) ${DST}.x = 1.0;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tif (a != c) ${DST}.y = 1.0;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tif (a != d) ${DST}.z = 1.0;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"basic_not_equal_vertex","Basic struct equality",true,0,
                            init()::Eval_basic_not_equal::eval(deqp::gls::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec3\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\tS a = S(floor(${COORDS}.x), vec3(0.0, floor(${COORDS}.y), 2.3), ui_one);");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\tS b = S(floor(${COORDS}.x+0.5), vec3(0.0, floor(${COORDS}.y), 2.3), ui_one);"
                     );
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\tS c = S(floor(${COORDS}.x), vec3(0.0, floor(${COORDS}.y+0.5), 2.3), ui_one);"
                     );
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\tS d = S(floor(${COORDS}.x), vec3(0.0, floor(${COORDS}.y), 2.3), ui_two);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = vec4(0.0, 0.0, 0.0, 1.0);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tif (a != b) ${DST}.x = 1.0;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tif (a != c) ${DST}.y = 1.0;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tif (a != d) ${DST}.z = 1.0;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"basic_not_equal_fragment","Basic struct equality",false,0,
                            init()::Eval_basic_not_equal::eval(deqp::gls::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec3\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tT\t\t\t\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\tS a = S(floor(${COORDS}.x), T(vec3(0.0, floor(${COORDS}.y), 2.3), ui_one), 1);"
                     );
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\tS b = S(floor(${COORDS}.x+0.5), T(vec3(0.0, floor(${COORDS}.y), 2.3), ui_one), 1);"
                     );
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\tS c = S(floor(${COORDS}.x), T(vec3(0.0, floor(${COORDS}.y+0.5), 2.3), ui_one), 1);"
                     );
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\tS d = S(floor(${COORDS}.x), T(vec3(0.0, floor(${COORDS}.y), 2.3), ui_two), 1);"
                     );
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = vec4(0.0, 0.0, 0.0, 1.0);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tif (a == b) ${DST}.x = 1.0;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tif (a == c) ${DST}.y = 1.0;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tif (a == d) ${DST}.z = 1.0;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"nested_equal_vertex","Nested struct struct equality",true,0,
                            init()::Eval_nested_equal::eval(deqp::gls::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec3\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tT\t\t\t\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\tS a = S(floor(${COORDS}.x), T(vec3(0.0, floor(${COORDS}.y), 2.3), ui_one), 1);"
                     );
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\tS b = S(floor(${COORDS}.x+0.5), T(vec3(0.0, floor(${COORDS}.y), 2.3), ui_one), 1);"
                     );
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\tS c = S(floor(${COORDS}.x), T(vec3(0.0, floor(${COORDS}.y+0.5), 2.3), ui_one), 1);"
                     );
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\tS d = S(floor(${COORDS}.x), T(vec3(0.0, floor(${COORDS}.y), 2.3), ui_two), 1);"
                     );
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = vec4(0.0, 0.0, 0.0, 1.0);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tif (a == b) ${DST}.x = 1.0;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tif (a == c) ${DST}.y = 1.0;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tif (a == d) ${DST}.z = 1.0;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"nested_equal_fragment","Nested struct struct equality",false,0,
                            init()::Eval_nested_equal::eval(deqp::gls::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec3\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tT\t\t\t\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\tS a = S(floor(${COORDS}.x), T(vec3(0.0, floor(${COORDS}.y), 2.3), ui_one), 1);"
                     );
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\tS b = S(floor(${COORDS}.x+0.5), T(vec3(0.0, floor(${COORDS}.y), 2.3), ui_one), 1);"
                     );
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\tS c = S(floor(${COORDS}.x), T(vec3(0.0, floor(${COORDS}.y+0.5), 2.3), ui_one), 1);"
                     );
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\tS d = S(floor(${COORDS}.x), T(vec3(0.0, floor(${COORDS}.y), 2.3), ui_two), 1);"
                     );
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = vec4(0.0, 0.0, 0.0, 1.0);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tif (a != b) ${DST}.x = 1.0;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tif (a != c) ${DST}.y = 1.0;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tif (a != d) ${DST}.z = 1.0;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"nested_not_equal_vertex","Nested struct struct equality",true,0,
                            init()::Eval_nested_not_equal::eval(deqp::gls::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0.m_stream);
  local_1c0.m_string._M_string_length = 0;
  local_1c0.m_string.field_2._M_local_buf[0] = '\0';
  local_1c0.m_indent = 0;
  local_1c0.m_string._M_dataplus._M_p = (pointer)paVar1;
  pLVar3 = deqp::gls::LineStream::operator<<(&local_1c0,"${DECLARATIONS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec3\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tT\t\t\t\tb;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\tS a = S(floor(${COORDS}.x), T(vec3(0.0, floor(${COORDS}.y), 2.3), ui_one), 1);"
                     );
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\tS b = S(floor(${COORDS}.x+0.5), T(vec3(0.0, floor(${COORDS}.y), 2.3), ui_one), 1);"
                     );
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\tS c = S(floor(${COORDS}.x), T(vec3(0.0, floor(${COORDS}.y+0.5), 2.3), ui_one), 1);"
                     );
  pLVar3 = deqp::gls::LineStream::operator<<
                     (pLVar3,
                      "\tS d = S(floor(${COORDS}.x), T(vec3(0.0, floor(${COORDS}.y), 2.3), ui_two), 1);"
                     );
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = vec4(0.0, 0.0, 0.0, 1.0);");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tif (a != b) ${DST}.x = 1.0;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tif (a != c) ${DST}.y = 1.0;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tif (a != d) ${DST}.z = 1.0;");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
  pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"nested_not_equal_fragment","Nested struct struct equality",false
                            ,0,init()::Eval_nested_not_equal::eval(deqp::gls::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  deqp::gls::LineStream::~LineStream(&local_1c0);
  return extraout_EAX;
}

Assistant:

void LocalStructTests::init (void)
{
	#define LOCAL_STRUCT_CASE(NAME, DESCRIPTION, FLAGS, SHADER_SRC, EVAL_FUNC_BODY)																\
		do {																																	\
			struct Eval_##NAME { static void eval (ShaderEvalContext& c) EVAL_FUNC_BODY };  /* NOLINT(EVAL_FUNC_BODY) */						\
			addChild(createStructCase(m_context, #NAME "_vertex", DESCRIPTION, true, FLAGS, &Eval_##NAME::eval, DE_NULL, SHADER_SRC));			\
			addChild(createStructCase(m_context, #NAME "_fragment", DESCRIPTION, false, FLAGS,&Eval_##NAME::eval, DE_NULL, SHADER_SRC));		\
		} while (deGetFalse())

	LOCAL_STRUCT_CASE(basic, "Basic struct usage", 0,
		LineStream()
		<< "${DECLARATIONS}"
		<< "uniform int ui_one;"
		<< ""
		<< "struct S {"
		<< "	mediump float	a;"
		<< "	mediump vec3	b;"
		<< "	int				c;"
		<< "};"
		<< ""
		<< "void main (void)"
		<< "{"
		<< "	S s = S(${COORDS}.x, vec3(0.0), ui_one);"
		<< "	s.b = ${COORDS}.yzw;"
		<< "	${DST} = vec4(s.a, s.b.x, s.b.y, s.c);"
		<< "	${ASSIGN_POS}"
		<< "}",
		{
			c.color.xyz() = c.coords.swizzle(0,1,2);
		});

	LOCAL_STRUCT_CASE(nested, "Nested struct", 0,
		LineStream()
		<< "${DECLARATIONS}"
		<< "uniform int ui_zero;"
		<< "uniform int ui_one;"
		<< ""
		<< "struct T {"
		<< "	int				a;"
		<< "	mediump vec2	b;"
		<< "};"
		<< "struct S {"
		<< "	mediump float	a;"
		<< "	T				b;"
		<< "	int				c;"
		<< "};"
		<< ""
		<< "void main (void)"
		<< "{"
		<< "	S s = S(${COORDS}.x, T(0, vec2(0.0)), ui_one);"
		<< "	s.b = T(ui_zero, ${COORDS}.yz);"
		<< "	${DST} = vec4(s.a, s.b.b, s.b.a + s.c);"
		<< "	${ASSIGN_POS}"
		<< "}",
		{
			c.color.xyz() = c.coords.swizzle(0,1,2);
		});

	LOCAL_STRUCT_CASE(array_member, "Struct with array member", 0,
		LineStream()
		<< "${DECLARATIONS}"
		<< "uniform int ui_one;"
		<< ""
		<< "struct S {"
		<< "	mediump float	a;"
		<< "	mediump float	b[3];"
		<< "	int				c;"
		<< "};"
		<< ""
		<< "void main (void)"
		<< "{"
		<< "	S s;"
		<< "	s.a = ${COORDS}.w;"
		<< "	s.c = ui_one;"
		<< "	s.b[0] = ${COORDS}.z;"
		<< "	s.b[1] = ${COORDS}.y;"
		<< "	s.b[2] = ${COORDS}.x;"
		<< "	${DST} = vec4(s.a, s.b[0], s.b[1], s.c);"
		<< "	${ASSIGN_POS}"
		<< "}",
		{
			c.color.xyz() = c.coords.swizzle(3,2,1);
		});

	LOCAL_STRUCT_CASE(array_member_dynamic_index, "Struct with array member, dynamic indexing", FLAG_REQUIRES_DYNAMIC_INDEXING,
		LineStream()
		<< "${DECLARATIONS}"
		<< "uniform int ui_zero;"
		<< "uniform int ui_one;"
		<< "uniform int ui_two;"
		<< ""
		<< "struct S {"
		<< "	mediump float	a;"
		<< "	mediump float	b[3];"
		<< "	int				c;"
		<< "};"
		<< ""
		<< "void main (void)"
		<< "{"
		<< "	S s;"
		<< "	s.a = ${COORDS}.w;"
		<< "	s.c = ui_one;"
		<< "	s.b[0] = ${COORDS}.z;"
		<< "	s.b[1] = ${COORDS}.y;"
		<< "	s.b[2] = ${COORDS}.x;"
		<< "	${DST} = vec4(s.b[ui_one], s.b[ui_zero], s.b[ui_two], s.c);"
		<< "	${ASSIGN_POS}"
		<< "}",
		{
			c.color.xyz() = c.coords.swizzle(1,2,0);
		});

	LOCAL_STRUCT_CASE(struct_array, "Struct array", 0,
		LineStream()
		<< "${DECLARATIONS}"
		<< "uniform int ui_zero;"
		<< "uniform int ui_one;"
		<< "uniform int ui_two;"
		<< ""
		<< "struct S {"
		<< "	mediump float	a;"
		<< "	mediump int		b;"
		<< "};"
		<< ""
		<< "void main (void)"
		<< "{"
		<< "	S s[3];"
		<< "	s[0] = S(${COORDS}.x, ui_zero);"
		<< "	s[1].a = ${COORDS}.y;"
		<< "	s[1].b = ui_one;"
		<< "	s[2] = S(${COORDS}.z, ui_two);"
		<< "	${DST} = vec4(s[2].a, s[1].a, s[0].a, s[2].b - s[1].b + s[0].b);"
		<< "	${ASSIGN_POS}"
		<< "}",
		{
			c.color.xyz() = c.coords.swizzle(2,1,0);
		});

	LOCAL_STRUCT_CASE(struct_array_dynamic_index, "Struct array with dynamic indexing", FLAG_REQUIRES_DYNAMIC_INDEXING,
		LineStream()
		<< "${DECLARATIONS}"
		<< "uniform int ui_zero;"
		<< "uniform int ui_one;"
		<< "uniform int ui_two;"
		<< ""
		<< "struct S {"
		<< "	mediump float	a;"
		<< "	mediump int		b;"
		<< "};"
		<< ""
		<< "void main (void)"
		<< "{"
		<< "	S s[3];"
		<< "	s[0] = S(${COORDS}.x, ui_zero);"
		<< "	s[1].a = ${COORDS}.y;"
		<< "	s[1].b = ui_one;"
		<< "	s[2] = S(${COORDS}.z, ui_two);"
		<< "	${DST} = vec4(s[ui_two].a, s[ui_one].a, s[ui_zero].a, s[ui_two].b - s[ui_one].b + s[ui_zero].b);"
		<< "	${ASSIGN_POS}"
		<< "}",
		{
			c.color.xyz() = c.coords.swizzle(2,1,0);
		});

	LOCAL_STRUCT_CASE(nested_struct_array, "Nested struct array", 0,
		LineStream()
		<< "${DECLARATIONS}"
		<< "uniform int ui_zero;"
		<< "uniform int ui_one;"
		<< "uniform int ui_two;"
		<< "uniform mediump float uf_two;"
		<< "uniform mediump float uf_three;"
		<< "uniform mediump float uf_four;"
		<< "uniform mediump float uf_half;"
		<< "uniform mediump float uf_third;"
		<< "uniform mediump float uf_fourth;"
		<< ""
		<< "struct T {"
		<< "	mediump float	a;"
		<< "	mediump vec2	b[2];"
		<< "};"
		<< "struct S {"
		<< "	mediump float	a;"
		<< "	T				b[3];"
		<< "	int				c;"
		<< "};"
		<< ""
		<< "void main (void)"
		<< "{"
		<< "	S s[2];"
		<< ""
		<< "	// S[0]"
		<< "	s[0].a         = ${COORDS}.x;"
		<< "	s[0].b[0].a    = uf_half;"
		<< "	s[0].b[0].b[0] = ${COORDS}.xy;"
		<< "	s[0].b[0].b[1] = ${COORDS}.zw;"
		<< "	s[0].b[1].a    = uf_third;"
		<< "	s[0].b[1].b[0] = ${COORDS}.zw;"
		<< "	s[0].b[1].b[1] = ${COORDS}.xy;"
		<< "	s[0].b[2].a    = uf_fourth;"
		<< "	s[0].b[2].b[0] = ${COORDS}.xz;"
		<< "	s[0].b[2].b[1] = ${COORDS}.yw;"
		<< "	s[0].c         = ui_zero;"
		<< ""
		<< "	// S[1]"
		<< "	s[1].a         = ${COORDS}.w;"
		<< "	s[1].b[0].a    = uf_two;"
		<< "	s[1].b[0].b[0] = ${COORDS}.xx;"
		<< "	s[1].b[0].b[1] = ${COORDS}.yy;"
		<< "	s[1].b[1].a    = uf_three;"
		<< "	s[1].b[1].b[0] = ${COORDS}.zz;"
		<< "	s[1].b[1].b[1] = ${COORDS}.ww;"
		<< "	s[1].b[2].a    = uf_four;"
		<< "	s[1].b[2].b[0] = ${COORDS}.yx;"
		<< "	s[1].b[2].b[1] = ${COORDS}.wz;"
		<< "	s[1].c         = ui_one;"
		<< ""
		<< "	mediump float r = (s[0].b[1].b[0].x + s[1].b[2].b[1].y) * s[0].b[0].a; // (z + z) * 0.5"
		<< "	mediump float g = s[1].b[0].b[0].y * s[0].b[2].a * s[1].b[2].a; // x * 0.25 * 4"
		<< "	mediump float b = (s[0].b[2].b[1].y + s[0].b[1].b[0].y + s[1].a) * s[0].b[1].a; // (w + w + w) * 0.333"
		<< "	mediump float a = float(s[0].c) + s[1].b[2].a - s[1].b[1].a; // 0 + 4.0 - 3.0"
		<< "	${DST} = vec4(r, g, b, a);"
		<< "	${ASSIGN_POS}"
		<< "}",
		{
			c.color.xyz() = c.coords.swizzle(2,0,3);
		});

	LOCAL_STRUCT_CASE(nested_struct_array_dynamic_index, "Nested struct array with dynamic indexing", FLAG_REQUIRES_DYNAMIC_INDEXING,
		LineStream()
		<< "${DECLARATIONS}"
		<< "uniform int ui_zero;"
		<< "uniform int ui_one;"
		<< "uniform int ui_two;"
		<< "uniform mediump float uf_two;"
		<< "uniform mediump float uf_three;"
		<< "uniform mediump float uf_four;"
		<< "uniform mediump float uf_half;"
		<< "uniform mediump float uf_third;"
		<< "uniform mediump float uf_fourth;"
		<< ""
		<< "struct T {"
		<< "	mediump float	a;"
		<< "	mediump vec2	b[2];"
		<< "};"
		<< "struct S {"
		<< "	mediump float	a;"
		<< "	T				b[3];"
		<< "	int				c;"
		<< "};"
		<< ""
		<< "void main (void)"
		<< "{"
		<< "	S s[2];"
		<< ""
		<< "	// S[0]"
		<< "	s[0].a         = ${COORDS}.x;"
		<< "	s[0].b[0].a    = uf_half;"
		<< "	s[0].b[0].b[0] = ${COORDS}.xy;"
		<< "	s[0].b[0].b[1] = ${COORDS}.zw;"
		<< "	s[0].b[1].a    = uf_third;"
		<< "	s[0].b[1].b[0] = ${COORDS}.zw;"
		<< "	s[0].b[1].b[1] = ${COORDS}.xy;"
		<< "	s[0].b[2].a    = uf_fourth;"
		<< "	s[0].b[2].b[0] = ${COORDS}.xz;"
		<< "	s[0].b[2].b[1] = ${COORDS}.yw;"
		<< "	s[0].c         = ui_zero;"
		<< ""
		<< "	// S[1]"
		<< "	s[1].a         = ${COORDS}.w;"
		<< "	s[1].b[0].a    = uf_two;"
		<< "	s[1].b[0].b[0] = ${COORDS}.xx;"
		<< "	s[1].b[0].b[1] = ${COORDS}.yy;"
		<< "	s[1].b[1].a    = uf_three;"
		<< "	s[1].b[1].b[0] = ${COORDS}.zz;"
		<< "	s[1].b[1].b[1] = ${COORDS}.ww;"
		<< "	s[1].b[2].a    = uf_four;"
		<< "	s[1].b[2].b[0] = ${COORDS}.yx;"
		<< "	s[1].b[2].b[1] = ${COORDS}.wz;"
		<< "	s[1].c         = ui_one;"
		<< ""
		<< "	mediump float r = (s[0].b[ui_one].b[ui_one-1].x + s[ui_one].b[ui_two].b[ui_zero+1].y) * s[0].b[0].a; // (z + z) * 0.5"
		<< "	mediump float g = s[ui_two-1].b[ui_two-2].b[ui_zero].y * s[0].b[ui_two].a * s[ui_one].b[2].a; // x * 0.25 * 4"
		<< "	mediump float b = (s[ui_zero].b[ui_one+1].b[1].y + s[0].b[ui_one*ui_one].b[0].y + s[ui_one].a) * s[0].b[ui_two-ui_one].a; // (w + w + w) * 0.333"
		<< "	mediump float a = float(s[ui_zero].c) + s[ui_one-ui_zero].b[ui_two].a - s[ui_zero+ui_one].b[ui_two-ui_one].a; // 0 + 4.0 - 3.0"
		<< "	${DST} = vec4(r, g, b, a);"
		<< "	${ASSIGN_POS}"
		<< "}",
		{
			c.color.xyz() = c.coords.swizzle(2,0,3);
		});

	LOCAL_STRUCT_CASE(parameter, "Struct as a function parameter", 0,
		LineStream()
		<< "${DECLARATIONS}"
		<< "uniform int ui_one;"
		<< ""
		<< "struct S {"
		<< "	mediump float	a;"
		<< "	mediump vec3	b;"
		<< "	int				c;"
		<< "};"
		<< ""
		<< "mediump vec4 myFunc (S s)"
		<< "{"
		<< "	return vec4(s.a, s.b.x, s.b.y, s.c);"
		<< "}"
		<< ""
		<< "void main (void)"
		<< "{"
		<< "	S s = S(${COORDS}.x, vec3(0.0), ui_one);"
		<< "	s.b = ${COORDS}.yzw;"
		<< "	${DST} = myFunc(s);"
		<< "	${ASSIGN_POS}"
		<< "}",
		{
			c.color.xyz() = c.coords.swizzle(0,1,2);
		});

	LOCAL_STRUCT_CASE(parameter_nested, "Nested struct as a function parameter", 0,
		LineStream()
		<< "${DECLARATIONS}"
		<< "uniform int ui_zero;"
		<< "uniform int ui_one;"
		<< ""
		<< "struct T {"
		<< "	int				a;"
		<< "	mediump vec2	b;"
		<< "};"
		<< "struct S {"
		<< "	mediump float	a;"
		<< "	T				b;"
		<< "	int				c;"
		<< "};"
		<< ""
		<< "mediump vec4 myFunc (S s)"
		<< "{"
		<< "	return vec4(s.a, s.b.b, s.b.a + s.c);"
		<< "}"
		<< ""
		<< "void main (void)"
		<< "{"
		<< "	S s = S(${COORDS}.x, T(0, vec2(0.0)), ui_one);"
		<< "	s.b = T(ui_zero, ${COORDS}.yz);"
		<< "	${DST} = myFunc(s);"
		<< "	${ASSIGN_POS}"
		<< "}",
		{
			c.color.xyz() = c.coords.swizzle(0,1,2);
		});

	LOCAL_STRUCT_CASE(return, "Struct as a return value", 0,
		LineStream()
		<< "${DECLARATIONS}"
		<< "uniform int ui_one;"
		<< ""
		<< "struct S {"
		<< "	mediump float	a;"
		<< "	mediump vec3	b;"
		<< "	int				c;"
		<< "};"
		<< ""
		<< "S myFunc (void)"
		<< "{"
		<< "	S s = S(${COORDS}.x, vec3(0.0), ui_one);"
		<< "	s.b = ${COORDS}.yzw;"
		<< "	return s;"
		<< "}"
		<< ""
		<< "void main (void)"
		<< "{"
		<< "	S s = myFunc();"
		<< "	${DST} = vec4(s.a, s.b.x, s.b.y, s.c);"
		<< "	${ASSIGN_POS}"
		<< "}",
		{
			c.color.xyz() = c.coords.swizzle(0,1,2);
		});

	LOCAL_STRUCT_CASE(return_nested, "Nested struct", 0,
		LineStream()
		<< "${DECLARATIONS}"
		<< "uniform int ui_zero;"
		<< "uniform int ui_one;"
		<< ""
		<< "struct T {"
		<< "	int				a;"
		<< "	mediump vec2	b;"
		<< "};"
		<< "struct S {"
		<< "	mediump float	a;"
		<< "	T				b;"
		<< "	int				c;"
		<< "};"
		<< ""
		<< "S myFunc (void)"
		<< "{"
		<< "	S s = S(${COORDS}.x, T(0, vec2(0.0)), ui_one);"
		<< "	s.b = T(ui_zero, ${COORDS}.yz);"
		<< "	return s;"
		<< "}"
		<< ""
		<< "void main (void)"
		<< "{"
		<< "	S s = myFunc();"
		<< "	${DST} = vec4(s.a, s.b.b, s.b.a + s.c);"
		<< "	${ASSIGN_POS}"
		<< "}",
		{
			c.color.xyz() = c.coords.swizzle(0,1,2);
		});

	LOCAL_STRUCT_CASE(conditional_assignment, "Conditional struct assignment", 0,
		LineStream()
		<< "${DECLARATIONS}"
		<< "uniform int ui_zero;"
		<< "uniform int ui_one;"
		<< "uniform mediump float uf_one;"
		<< ""
		<< "struct S {"
		<< "	mediump float	a;"
		<< "	mediump vec3	b;"
		<< "	int				c;"
		<< "};"
		<< ""
		<< "void main (void)"
		<< "{"
		<< "	S s = S(${COORDS}.x, ${COORDS}.yzw, ui_zero);"
		<< "	if (uf_one > 0.0)"
		<< "		s = S(${COORDS}.w, ${COORDS}.zyx, ui_one);"
		<< "	${DST} = vec4(s.a, s.b.xy, s.c);"
		<< "	${ASSIGN_POS}"
		<< "}",
		{
			c.color.xyz() = c.coords.swizzle(3,2,1);
		});

	LOCAL_STRUCT_CASE(loop_assignment, "Struct assignment in loop", 0,
		LineStream()
		<< "${DECLARATIONS}"
		<< "uniform int ui_zero;"
		<< "uniform int ui_one;"
		<< ""
		<< "struct S {"
		<< "	mediump float	a;"
		<< "	mediump vec3	b;"
		<< "	int				c;"
		<< "};"
		<< ""
		<< "void main (void)"
		<< "{"
		<< "	S s = S(${COORDS}.x, ${COORDS}.yzw, ui_zero);"
		<< "	for (int i = 0; i < 3; i++)"
		<< "	{"
		<< "		if (i == 1)"
		<< "			s = S(${COORDS}.w, ${COORDS}.zyx, ui_one);"
		<< "	}"
		<< "	${DST} = vec4(s.a, s.b.xy, s.c);"
		<< "	${ASSIGN_POS}"
		<< "}",
		{
			c.color.xyz() = c.coords.swizzle(3,2,1);
		});

	LOCAL_STRUCT_CASE(dynamic_loop_assignment, "Struct assignment in loop", FLAG_REQUIRES_DYNAMIC_INDEXING,
		LineStream()
		<< "${DECLARATIONS}"
		<< "uniform int ui_zero;"
		<< "uniform int ui_one;"
		<< "uniform int ui_three;"
		<< ""
		<< "struct S {"
		<< "	mediump float	a;"
		<< "	mediump vec3	b;"
		<< "	int				c;"
		<< "};"
		<< ""
		<< "void main (void)"
		<< "{"
		<< "	S s = S(${COORDS}.x, ${COORDS}.yzw, ui_zero);"
		<< "	for (int i = 0; i < ui_three; i++)"
		<< "	{"
		<< "		if (i == ui_one)"
		<< "			s = S(${COORDS}.w, ${COORDS}.zyx, ui_one);"
		<< "	}"
		<< "	${DST} = vec4(s.a, s.b.xy, s.c);"
		<< "	${ASSIGN_POS}"
		<< "}",
		{
			c.color.xyz() = c.coords.swizzle(3,2,1);
		});

	LOCAL_STRUCT_CASE(nested_conditional_assignment, "Conditional assignment of nested struct", 0,
		LineStream()
		<< "${DECLARATIONS}"
		<< "uniform int ui_zero;"
		<< "uniform int ui_one;"
		<< "uniform mediump float uf_one;"
		<< ""
		<< "struct T {"
		<< "	int				a;"
		<< "	mediump vec2	b;"
		<< "};"
		<< "struct S {"
		<< "	mediump float	a;"
		<< "	T				b;"
		<< "	int				c;"
		<< "};"
		<< ""
		<< "void main (void)"
		<< "{"
		<< "	S s = S(${COORDS}.x, T(ui_one, ${COORDS}.yz), ui_one);"
		<< "	if (uf_one > 0.0)"
		<< "		s.b = T(ui_zero, ${COORDS}.zw);"
		<< "	${DST} = vec4(s.a, s.b.b, s.c - s.b.a);"
		<< "	${ASSIGN_POS}"
		<< "}",
		{
			c.color.xyz() = c.coords.swizzle(0,2,3);
		});

	LOCAL_STRUCT_CASE(nested_loop_assignment, "Nested struct assignment in loop", 0,
		LineStream()
		<< "${DECLARATIONS}"
		<< "uniform int ui_zero;"
		<< "uniform int ui_one;"
		<< "uniform mediump float uf_one;"
		<< ""
		<< "struct T {"
		<< "	int				a;"
		<< "	mediump vec2	b;"
		<< "};"
		<< "struct S {"
		<< "	mediump float	a;"
		<< "	T				b;"
		<< "	int				c;"
		<< "};"
		<< ""
		<< "void main (void)"
		<< "{"
		<< "	S s = S(${COORDS}.x, T(ui_one, ${COORDS}.yz), ui_one);"
		<< "	for (int i = 0; i < 3; i++)"
		<< "	{"
		<< "		if (i == 1)"
		<< "			s.b = T(ui_zero, ${COORDS}.zw);"
		<< "	}"
		<< "	${DST} = vec4(s.a, s.b.b, s.c - s.b.a);"
		<< "	${ASSIGN_POS}"
		<< "}",
		{
			c.color.xyz() = c.coords.swizzle(0,2,3);
		});

	LOCAL_STRUCT_CASE(nested_dynamic_loop_assignment, "Nested struct assignment in dynamic loop", FLAG_REQUIRES_DYNAMIC_INDEXING,
		LineStream()
		<< "${DECLARATIONS}"
		<< "uniform int ui_zero;"
		<< "uniform int ui_one;"
		<< "uniform int ui_three;"
		<< "uniform mediump float uf_one;"
		<< ""
		<< "struct T {"
		<< "	int				a;"
		<< "	mediump vec2	b;"
		<< "};"
		<< "struct S {"
		<< "	mediump float	a;"
		<< "	T				b;"
		<< "	int				c;"
		<< "};"
		<< ""
		<< "void main (void)"
		<< "{"
		<< "	S s = S(${COORDS}.x, T(ui_one, ${COORDS}.yz), ui_one);"
		<< "	for (int i = 0; i < ui_three; i++)"
		<< "	{"
		<< "		if (i == ui_one)"
		<< "			s.b = T(ui_zero, ${COORDS}.zw);"
		<< "	}"
		<< "	${DST} = vec4(s.a, s.b.b, s.c - s.b.a);"
		<< "	${ASSIGN_POS}"
		<< "}",
		{
			c.color.xyz() = c.coords.swizzle(0,2,3);
		});

	LOCAL_STRUCT_CASE(loop_struct_array, "Struct array usage in loop", 0,
		LineStream()
		<< "${DECLARATIONS}"
		<< "uniform int ui_zero;"
		<< "uniform int ui_one;"
		<< "uniform int ui_two;"
		<< ""
		<< "struct S {"
		<< "	mediump float	a;"
		<< "	mediump int		b;"
		<< "};"
		<< ""
		<< "void main (void)"
		<< "{"
		<< "	S s[3];"
		<< "	s[0] = S(${COORDS}.x, ui_zero);"
		<< "	s[1].a = ${COORDS}.y;"
		<< "	s[1].b = -ui_one;"
		<< "	s[2] = S(${COORDS}.z, ui_two);"
		<< ""
		<< "	mediump float rgb[3];"
		<< "	int alpha = 0;"
		<< "	for (int i = 0; i < 3; i++)"
		<< "	{"
		<< "		rgb[i] = s[2-i].a;"
		<< "		alpha += s[i].b;"
		<< "	}"
		<< "	${DST} = vec4(rgb[0], rgb[1], rgb[2], alpha);"
		<< "	${ASSIGN_POS}"
		<< "}",
		{
			c.color.xyz() = c.coords.swizzle(2,1,0);
		});

	LOCAL_STRUCT_CASE(loop_nested_struct_array, "Nested struct array usage in loop", 0,
		LineStream()
		<< "${DECLARATIONS}"
		<< "uniform int ui_zero;"
		<< "uniform int ui_one;"
		<< "uniform int ui_two;"
		<< "uniform mediump float uf_two;"
		<< "uniform mediump float uf_three;"
		<< "uniform mediump float uf_four;"
		<< "uniform mediump float uf_half;"
		<< "uniform mediump float uf_third;"
		<< "uniform mediump float uf_fourth;"
		<< "uniform mediump float uf_sixth;"
		<< ""
		<< "struct T {"
		<< "	mediump float	a;"
		<< "	mediump vec2	b[2];"
		<< "};"
		<< "struct S {"
		<< "	mediump float	a;"
		<< "	T				b[3];"
		<< "	int				c;"
		<< "};"
		<< ""
		<< "void main (void)"
		<< "{"
		<< "	S s[2];"
		<< ""
		<< "	// S[0]"
		<< "	s[0].a         = ${COORDS}.x;"
		<< "	s[0].b[0].a    = uf_half;"
		<< "	s[0].b[0].b[0] = ${COORDS}.yx;"
		<< "	s[0].b[0].b[1] = ${COORDS}.zx;"
		<< "	s[0].b[1].a    = uf_third;"
		<< "	s[0].b[1].b[0] = ${COORDS}.yy;"
		<< "	s[0].b[1].b[1] = ${COORDS}.wy;"
		<< "	s[0].b[2].a    = uf_fourth;"
		<< "	s[0].b[2].b[0] = ${COORDS}.zx;"
		<< "	s[0].b[2].b[1] = ${COORDS}.zy;"
		<< "	s[0].c         = ui_zero;"
		<< ""
		<< "	// S[1]"
		<< "	s[1].a         = ${COORDS}.w;"
		<< "	s[1].b[0].a    = uf_two;"
		<< "	s[1].b[0].b[0] = ${COORDS}.zx;"
		<< "	s[1].b[0].b[1] = ${COORDS}.zy;"
		<< "	s[1].b[1].a    = uf_three;"
		<< "	s[1].b[1].b[0] = ${COORDS}.zz;"
		<< "	s[1].b[1].b[1] = ${COORDS}.ww;"
		<< "	s[1].b[2].a    = uf_four;"
		<< "	s[1].b[2].b[0] = ${COORDS}.yx;"
		<< "	s[1].b[2].b[1] = ${COORDS}.wz;"
		<< "	s[1].c         = ui_one;"
		<< ""
		<< "	mediump float r = 0.0; // (x*3 + y*3) / 6.0"
		<< "	mediump float g = 0.0; // (y*3 + z*3) / 6.0"
		<< "	mediump float b = 0.0; // (z*3 + w*3) / 6.0"
		<< "	mediump float a = 1.0;"
		<< "	for (int i = 0; i < 2; i++)"
		<< "	{"
		<< "		for (int j = 0; j < 3; j++)"
		<< "		{"
		<< "			r += s[0].b[j].b[i].y;"
		<< "			g += s[i].b[j].b[0].x;"
		<< "			b += s[i].b[j].b[1].x;"
		<< "			a *= s[i].b[j].a;"
		<< "		}"
		<< "	}"
		<< "	${DST} = vec4(r*uf_sixth, g*uf_sixth, b*uf_sixth, a);"
		<< "	${ASSIGN_POS}"
		<< "}",
		{
			c.color.xyz() = (c.coords.swizzle(0,1,2) + c.coords.swizzle(1,2,3)) * 0.5f;
		});

	LOCAL_STRUCT_CASE(dynamic_loop_struct_array, "Struct array usage in dynamic loop", FLAG_REQUIRES_DYNAMIC_INDEXING|FLAG_REQUIRES_DYNAMIC_LOOPS,
		LineStream()
		<< "${DECLARATIONS}"
		<< "uniform int ui_zero;"
		<< "uniform int ui_one;"
		<< "uniform int ui_two;"
		<< "uniform int ui_three;"
		<< ""
		<< "struct S {"
		<< "	mediump float	a;"
		<< "	mediump int		b;"
		<< "};"
		<< ""
		<< "void main (void)"
		<< "{"
		<< "	S s[3];"
		<< "	s[0] = S(${COORDS}.x, ui_zero);"
		<< "	s[1].a = ${COORDS}.y;"
		<< "	s[1].b = -ui_one;"
		<< "	s[2] = S(${COORDS}.z, ui_two);"
		<< ""
		<< "	mediump float rgb[3];"
		<< "	int alpha = 0;"
		<< "	for (int i = 0; i < ui_three; i++)"
		<< "	{"
		<< "		rgb[i] = s[2-i].a;"
		<< "		alpha += s[i].b;"
		<< "	}"
		<< "	${DST} = vec4(rgb[0], rgb[1], rgb[2], alpha);"
		<< "	${ASSIGN_POS}"
		<< "}",
		{
			c.color.xyz() = c.coords.swizzle(2,1,0);
		});

	LOCAL_STRUCT_CASE(dynamic_loop_nested_struct_array, "Nested struct array usage in dynamic loop", FLAG_REQUIRES_DYNAMIC_INDEXING|FLAG_REQUIRES_DYNAMIC_LOOPS,
		LineStream()
		<< "${DECLARATIONS}"
		<< "uniform int ui_zero;"
		<< "uniform int ui_one;"
		<< "uniform int ui_two;"
		<< "uniform int ui_three;"
		<< "uniform mediump float uf_two;"
		<< "uniform mediump float uf_three;"
		<< "uniform mediump float uf_four;"
		<< "uniform mediump float uf_half;"
		<< "uniform mediump float uf_third;"
		<< "uniform mediump float uf_fourth;"
		<< "uniform mediump float uf_sixth;"
		<< ""
		<< "struct T {"
		<< "	mediump float	a;"
		<< "	mediump vec2	b[2];"
		<< "};"
		<< "struct S {"
		<< "	mediump float	a;"
		<< "	T				b[3];"
		<< "	int				c;"
		<< "};"
		<< ""
		<< "void main (void)"
		<< "{"
		<< "	S s[2];"
		<< ""
		<< "	// S[0]"
		<< "	s[0].a         = ${COORDS}.x;"
		<< "	s[0].b[0].a    = uf_half;"
		<< "	s[0].b[0].b[0] = ${COORDS}.yx;"
		<< "	s[0].b[0].b[1] = ${COORDS}.zx;"
		<< "	s[0].b[1].a    = uf_third;"
		<< "	s[0].b[1].b[0] = ${COORDS}.yy;"
		<< "	s[0].b[1].b[1] = ${COORDS}.wy;"
		<< "	s[0].b[2].a    = uf_fourth;"
		<< "	s[0].b[2].b[0] = ${COORDS}.zx;"
		<< "	s[0].b[2].b[1] = ${COORDS}.zy;"
		<< "	s[0].c         = ui_zero;"
		<< ""
		<< "	// S[1]"
		<< "	s[1].a         = ${COORDS}.w;"
		<< "	s[1].b[0].a    = uf_two;"
		<< "	s[1].b[0].b[0] = ${COORDS}.zx;"
		<< "	s[1].b[0].b[1] = ${COORDS}.zy;"
		<< "	s[1].b[1].a    = uf_three;"
		<< "	s[1].b[1].b[0] = ${COORDS}.zz;"
		<< "	s[1].b[1].b[1] = ${COORDS}.ww;"
		<< "	s[1].b[2].a    = uf_four;"
		<< "	s[1].b[2].b[0] = ${COORDS}.yx;"
		<< "	s[1].b[2].b[1] = ${COORDS}.wz;"
		<< "	s[1].c         = ui_one;"
		<< ""
		<< "	mediump float r = 0.0; // (x*3 + y*3) / 6.0"
		<< "	mediump float g = 0.0; // (y*3 + z*3) / 6.0"
		<< "	mediump float b = 0.0; // (z*3 + w*3) / 6.0"
		<< "	mediump float a = 1.0;"
		<< "	for (int i = 0; i < ui_two; i++)"
		<< "	{"
		<< "		for (int j = 0; j < ui_three; j++)"
		<< "		{"
		<< "			r += s[0].b[j].b[i].y;"
		<< "			g += s[i].b[j].b[0].x;"
		<< "			b += s[i].b[j].b[1].x;"
		<< "			a *= s[i].b[j].a;"
		<< "		}"
		<< "	}"
		<< "	${DST} = vec4(r*uf_sixth, g*uf_sixth, b*uf_sixth, a);"
		<< "	${ASSIGN_POS}"
		<< "}",
		{
			c.color.xyz() = (c.coords.swizzle(0,1,2) + c.coords.swizzle(1,2,3)) * 0.5f;
		});

	LOCAL_STRUCT_CASE(basic_equal, "Basic struct equality", 0,
		LineStream()
		<< "${DECLARATIONS}"
		<< "uniform int ui_one;"
		<< "uniform int ui_two;"
		<< ""
		<< "struct S {"
		<< "	mediump float	a;"
		<< "	mediump vec3	b;"
		<< "	int				c;"
		<< "};"
		<< ""
		<< "void main (void)"
		<< "{"
		<< "	S a = S(floor(${COORDS}.x), vec3(0.0, floor(${COORDS}.y), 2.3), ui_one);"
		<< "	S b = S(floor(${COORDS}.x+0.5), vec3(0.0, floor(${COORDS}.y), 2.3), ui_one);"
		<< "	S c = S(floor(${COORDS}.x), vec3(0.0, floor(${COORDS}.y+0.5), 2.3), ui_one);"
		<< "	S d = S(floor(${COORDS}.x), vec3(0.0, floor(${COORDS}.y), 2.3), ui_two);"
		<< "	${DST} = vec4(0.0, 0.0, 0.0, 1.0);"
		<< "	if (a == b) ${DST}.x = 1.0;"
		<< "	if (a == c) ${DST}.y = 1.0;"
		<< "	if (a == d) ${DST}.z = 1.0;"
		<< "	${ASSIGN_POS}"
		<< "}",
		{
			if (deFloatFloor(c.coords[0]) == deFloatFloor(c.coords[0]+0.5f))
				c.color.x() = 1.0f;
			if (deFloatFloor(c.coords[1]) == deFloatFloor(c.coords[1]+0.5f))
				c.color.y() = 1.0f;
		});

	LOCAL_STRUCT_CASE(basic_not_equal, "Basic struct equality", 0,
		LineStream()
		<< "${DECLARATIONS}"
		<< "uniform int ui_one;"
		<< "uniform int ui_two;"
		<< ""
		<< "struct S {"
		<< "	mediump float	a;"
		<< "	mediump vec3	b;"
		<< "	int				c;"
		<< "};"
		<< ""
		<< "void main (void)"
		<< "{"
		<< "	S a = S(floor(${COORDS}.x), vec3(0.0, floor(${COORDS}.y), 2.3), ui_one);"
		<< "	S b = S(floor(${COORDS}.x+0.5), vec3(0.0, floor(${COORDS}.y), 2.3), ui_one);"
		<< "	S c = S(floor(${COORDS}.x), vec3(0.0, floor(${COORDS}.y+0.5), 2.3), ui_one);"
		<< "	S d = S(floor(${COORDS}.x), vec3(0.0, floor(${COORDS}.y), 2.3), ui_two);"
		<< "	${DST} = vec4(0.0, 0.0, 0.0, 1.0);"
		<< "	if (a != b) ${DST}.x = 1.0;"
		<< "	if (a != c) ${DST}.y = 1.0;"
		<< "	if (a != d) ${DST}.z = 1.0;"
		<< "	${ASSIGN_POS}"
		<< "}",
		{
			if (deFloatFloor(c.coords[0]) != deFloatFloor(c.coords[0]+0.5f))
				c.color.x() = 1.0f;
			if (deFloatFloor(c.coords[1]) != deFloatFloor(c.coords[1]+0.5f))
				c.color.y() = 1.0f;
			c.color.z() = 1.0f;
		});

	LOCAL_STRUCT_CASE(nested_equal, "Nested struct struct equality", 0,
		LineStream()
		<< "${DECLARATIONS}"
		<< "uniform int ui_one;"
		<< "uniform int ui_two;"
		<< ""
		<< "struct T {"
		<< "	mediump vec3	a;"
		<< "	int				b;"
		<< "};"
		<< "struct S {"
		<< "	mediump float	a;"
		<< "	T				b;"
		<< "	int				c;"
		<< "};"
		<< ""
		<< "void main (void)"
		<< "{"
		<< "	S a = S(floor(${COORDS}.x), T(vec3(0.0, floor(${COORDS}.y), 2.3), ui_one), 1);"
		<< "	S b = S(floor(${COORDS}.x+0.5), T(vec3(0.0, floor(${COORDS}.y), 2.3), ui_one), 1);"
		<< "	S c = S(floor(${COORDS}.x), T(vec3(0.0, floor(${COORDS}.y+0.5), 2.3), ui_one), 1);"
		<< "	S d = S(floor(${COORDS}.x), T(vec3(0.0, floor(${COORDS}.y), 2.3), ui_two), 1);"
		<< "	${DST} = vec4(0.0, 0.0, 0.0, 1.0);"
		<< "	if (a == b) ${DST}.x = 1.0;"
		<< "	if (a == c) ${DST}.y = 1.0;"
		<< "	if (a == d) ${DST}.z = 1.0;"
		<< "	${ASSIGN_POS}"
		<< "}",
		{
			if (deFloatFloor(c.coords[0]) == deFloatFloor(c.coords[0]+0.5f))
				c.color.x() = 1.0f;
			if (deFloatFloor(c.coords[1]) == deFloatFloor(c.coords[1]+0.5f))
				c.color.y() = 1.0f;
		});

	LOCAL_STRUCT_CASE(nested_not_equal, "Nested struct struct equality", 0,
		LineStream()
		<< "${DECLARATIONS}"
		<< "uniform int ui_one;"
		<< "uniform int ui_two;"
		<< ""
		<< "struct T {"
		<< "	mediump vec3	a;"
		<< "	int				b;"
		<< "};"
		<< "struct S {"
		<< "	mediump float	a;"
		<< "	T				b;"
		<< "	int				c;"
		<< "};"
		<< ""
		<< "void main (void)"
		<< "{"
		<< "	S a = S(floor(${COORDS}.x), T(vec3(0.0, floor(${COORDS}.y), 2.3), ui_one), 1);"
		<< "	S b = S(floor(${COORDS}.x+0.5), T(vec3(0.0, floor(${COORDS}.y), 2.3), ui_one), 1);"
		<< "	S c = S(floor(${COORDS}.x), T(vec3(0.0, floor(${COORDS}.y+0.5), 2.3), ui_one), 1);"
		<< "	S d = S(floor(${COORDS}.x), T(vec3(0.0, floor(${COORDS}.y), 2.3), ui_two), 1);"
		<< "	${DST} = vec4(0.0, 0.0, 0.0, 1.0);"
		<< "	if (a != b) ${DST}.x = 1.0;"
		<< "	if (a != c) ${DST}.y = 1.0;"
		<< "	if (a != d) ${DST}.z = 1.0;"
		<< "	${ASSIGN_POS}"
		<< "}",
		{
			if (deFloatFloor(c.coords[0]) != deFloatFloor(c.coords[0]+0.5f))
				c.color.x() = 1.0f;
			if (deFloatFloor(c.coords[1]) != deFloatFloor(c.coords[1]+0.5f))
				c.color.y() = 1.0f;
			c.color.z() = 1.0f;
		});
}